

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O2

float Amap_CutAreaRef(Amap_Man_t *p,Amap_Mat_t *pM)

{
  Amap_Cut_t *pAVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Amap_Gat_t *pAVar6;
  Amap_Obj_t *pAVar7;
  uint uVar8;
  ulong uVar9;
  float fVar10;
  float local_34;
  
  pAVar6 = Amap_LibGate(p->pLib,(uint)*(ushort *)&pM->pSet->field_0x8);
  local_34 = (float)pAVar6->dArea;
  uVar9 = 0;
  while( true ) {
    pAVar1 = pM->pCut;
    if ((uint)*pAVar1 >> 0x11 <= uVar9) {
      return local_34;
    }
    uVar3 = Abc_Lit2Var((int)pM->pSet->Ins[uVar9]);
    iVar4 = Abc_Lit2Var((int)pAVar1[(ulong)uVar3 + 1]);
    pAVar7 = Amap_ManObj(p,iVar4);
    uVar3 = Abc_LitIsCompl((int)pM->pSet->Ins[uVar9]);
    pAVar1 = pM->pCut;
    uVar5 = Abc_Lit2Var((int)pM->pSet->Ins[uVar9]);
    uVar5 = Abc_LitIsCompl((int)pAVar1[(ulong)uVar5 + 1]);
    if (pAVar7->nFouts[1] + pAVar7->nFouts[0] < 0) break;
    uVar8 = uVar5 ^ uVar3;
    uVar2 = *(undefined8 *)pAVar7;
    iVar4 = pAVar7->nFouts[uVar8];
    if ((uVar8 != -(int)((long)uVar2 >> 0x3f)) && (iVar4 == 0)) {
      local_34 = local_34 + p->fAreaInv;
      iVar4 = 0;
    }
    pAVar7->nFouts[uVar8] = iVar4 + 1;
    if ((iVar4 + pAVar7->nFouts[uVar3 == uVar5] == 0) &&
       (uVar3 = (uint)uVar2, (uVar3 & 6) == 4 || (uVar3 & 7) == 6)) {
      fVar10 = Amap_CutAreaRef(p,&pAVar7->Best);
      local_34 = local_34 + fVar10;
    }
    uVar9 = uVar9 + 1;
  }
  __assert_fail("Amap_ObjRefsTotal(pFanin) >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapMatch.c"
                ,0x16e,"float Amap_CutAreaRef(Amap_Man_t *, Amap_Mat_t *)");
}

Assistant:

static inline float Amap_CutAreaRef( Amap_Man_t * p, Amap_Mat_t * pM )
{
    Amap_Obj_t * pFanin;
    int i, fCompl;
    float Area = Amap_LibGate( p->pLib, pM->pSet->iGate )->dArea;
    Amap_MatchForEachFaninCompl( p, pM, pFanin, fCompl, i )
    {
        assert( Amap_ObjRefsTotal(pFanin) >= 0 );
        if ( (int)pFanin->fPolar != fCompl && pFanin->nFouts[fCompl] == 0 )
            Area += p->fAreaInv;
        if ( pFanin->nFouts[fCompl]++ + pFanin->nFouts[!fCompl] == 0 && Amap_ObjIsNode(pFanin) )
            Area += Amap_CutAreaRef( p, &pFanin->Best );
    }
    return Area;
}